

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76496.c
# Opt level: O0

void sn76496_connect_t6w28(void *noisechip,void *tonechip)

{
  sn76496_state *Rtone;
  sn76496_state *Rnoise;
  void *tonechip_local;
  void *noisechip_local;
  
  *(undefined1 *)((long)tonechip + 0x108) = 0x80;
  *(void **)((long)tonechip + 0x110) = noisechip;
  *(undefined1 *)((long)noisechip + 0x108) = 0x81;
  *(void **)((long)noisechip + 0x110) = tonechip;
  return;
}

Assistant:

static void sn76496_connect_t6w28(void *noisechip, void *tonechip)
{
	sn76496_state *Rnoise = (sn76496_state *)noisechip;
	sn76496_state *Rtone = (sn76496_state *)tonechip;
	
	// Activate special NeoGeoPocket Mode
	Rtone->NgpFlags = 0x80 | 0x00;
	Rtone->NgpChip2 = Rnoise;
	Rnoise->NgpFlags = 0x80 | 0x01;
	Rnoise->NgpChip2 = Rtone;
	
	return;
}